

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void newProcess(void)

{
  int iVar1;
  int iVar2;
  list<MemBlock*,std::allocator<MemBlock*>> *plVar3;
  bool bVar4;
  list<MemBlock*,std::allocator<MemBlock*>> *plVar5;
  char *pcVar6;
  long lVar7;
  list<MemBlock_*,_std::allocator<MemBlock_*>_> *plVar8;
  _List_node_base *p_Var9;
  _List_node_base *p_Var10;
  _List_node_base *p_Var11;
  long lVar12;
  list<MemBlock*,std::allocator<MemBlock*>> *plVar13;
  list<MemBlock_*,_std::allocator<MemBlock_*>_> *__range1;
  long lVar14;
  bool bVar15;
  int mem;
  list<MemBlock_*,_std::allocator<MemBlock_*>_> __carry;
  char name [50];
  int local_69c;
  _List_node_base *local_698;
  _List_node_base local_690;
  _List_node_base *local_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined2 local_648;
  _List_node_base local_638;
  undefined8 local_628;
  list<MemBlock*,std::allocator<MemBlock*>> local_620 [1512];
  list<MemBlock*,std::allocator<MemBlock*>> local_38 [8];
  
  local_658 = 0;
  uStack_650 = 0;
  local_668 = 0;
  uStack_660 = 0;
  local_678 = 0;
  uStack_670 = 0;
  local_648 = 0;
  local_69c = 0;
  pcVar6 = strtok((char *)0x0," ");
  if (pcVar6 == (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"have no enough args",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    return;
  }
  strcpy((char *)&local_678,pcVar6);
  pcVar6 = strtok((char *)0x0," ");
  if (pcVar6 == (char *)0x0) {
    pcVar6 = "have no enough args";
    lVar7 = 0x13;
LAB_001023b3:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
  }
  else {
    __isoc99_sscanf(pcVar6,"%d",&local_69c);
    if ((freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
         _M_impl._M_node.super__List_node_base._M_next !=
         (_List_node_base *)&freeMemBlockList_abi_cxx11_) &&
       ((freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
         _M_impl._M_node.super__List_node_base._M_next)->_M_next !=
        (_List_node_base *)&freeMemBlockList_abi_cxx11_)) {
      local_690._M_next = &local_690;
      local_680 = (_List_node_base *)0x0;
      lVar7 = 0;
      do {
        lVar12 = (long)&local_638._M_next + lVar7;
        *(long *)((long)&local_638._M_prev + lVar7) = lVar12;
        *(long *)lVar12 = lVar12;
        *(undefined8 *)((long)&local_628 + lVar7) = 0;
        lVar7 = lVar7 + 0x18;
      } while (lVar7 != 0x600);
      lVar7 = 0;
      local_690._M_prev = local_690._M_next;
      do {
        if ((freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
             _M_impl._M_node.super__List_node_base._M_next)->_M_next != local_690._M_next &&
            local_690._M_next !=
            freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
            _M_impl._M_node.super__List_node_base._M_next) {
          std::__detail::_List_node_base::_M_transfer
                    (local_690._M_next,
                     freeMemBlockList_abi_cxx11_.
                     super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
                     super__List_node_base._M_next);
          local_680 = (_List_node_base *)((long)&local_680->_M_next + 1);
          freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
          _M_impl._M_node._M_size =
               freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>
               ._M_impl._M_node._M_size - 1;
        }
        local_698 = (_List_node_base *)((long)&local_638._M_next + lVar7);
        lVar12 = 0x18;
        if (lVar7 == 0) {
          bVar4 = true;
          p_Var9 = &local_638;
        }
        else {
          p_Var10 = &local_638;
          lVar14 = lVar7;
          do {
            bVar15 = p_Var10 == p_Var10->_M_next;
            bVar4 = !bVar15;
            if (bVar15) {
              lVar12 = 0;
              p_Var9 = p_Var10;
              break;
            }
            std::__cxx11::list<MemBlock*,std::allocator<MemBlock*>>::merge<newProcess()::__0>
                      ((list<MemBlock*,std::allocator<MemBlock*>> *)p_Var10,&local_690);
            std::__detail::_List_node_base::swap(&local_690,p_Var10);
            p_Var11 = p_Var10[1]._M_next;
            p_Var10[1]._M_next = local_680;
            p_Var10 = (_List_node_base *)&p_Var10[1]._M_prev;
            lVar14 = lVar14 + -0x18;
            p_Var9 = local_698;
            local_680 = p_Var11;
          } while (lVar14 != 0);
        }
        std::__detail::_List_node_base::swap(&local_690,p_Var9);
        p_Var10 = p_Var9[1]._M_next;
        p_Var9[1]._M_next = local_680;
        lVar7 = lVar12 + lVar7;
        local_680 = p_Var10;
      } while (freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>
               ._M_impl._M_node.super__List_node_base._M_next !=
               (_List_node_base *)&freeMemBlockList_abi_cxx11_);
      if (lVar7 != 0x18) {
        plVar13 = local_620;
        do {
          std::__cxx11::list<MemBlock*,std::allocator<MemBlock*>>::merge<newProcess()::__0>
                    (plVar13,plVar13 + -0x18);
          plVar13 = plVar13 + 0x18;
        } while (plVar13 !=
                 (list<MemBlock*,std::allocator<MemBlock*>> *)((long)&local_638._M_next + lVar7));
      }
      plVar13 = local_620 + 0x5e8;
      p_Var9 = local_698 + 1;
      p_Var10 = local_698;
      if (!bVar4) {
        p_Var9 = (_List_node_base *)&local_698[-1]._M_prev;
        p_Var10 = (_List_node_base *)&local_698[-2]._M_prev;
      }
      std::__detail::_List_node_base::swap((_List_node_base *)&freeMemBlockList_abi_cxx11_,p_Var10);
      p_Var10 = p_Var9->_M_next;
      p_Var9->_M_next =
           (_List_node_base *)
           freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
           _M_impl._M_node._M_size;
      freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
      _M_node._M_size = (size_t)p_Var10;
      do {
        plVar5 = plVar13 + -0x18;
        plVar13 = plVar13 + -0x18;
        plVar5 = *(list<MemBlock*,std::allocator<MemBlock*>> **)plVar5;
        while (plVar5 != plVar13) {
          plVar3 = *(list<MemBlock*,std::allocator<MemBlock*>> **)plVar5;
          operator_delete(plVar5);
          plVar5 = plVar3;
        }
        p_Var9 = local_690._M_next;
      } while ((_List_node_base *)plVar13 != &local_638);
      while (p_Var9 != &local_690) {
        p_Var10 = p_Var9->_M_next;
        operator_delete(p_Var9);
        p_Var9 = p_Var10;
      }
    }
    iVar2 = local_69c;
    plVar8 = &freeMemBlockList_abi_cxx11_;
    do {
      plVar8 = (list<MemBlock_*,_std::allocator<MemBlock_*>_> *)
               (plVar8->super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>)._M_impl._M_node.
               super__List_node_base._M_next;
      if (plVar8 == &freeMemBlockList_abi_cxx11_) {
        pcVar6 = "can\'t create new process, reason: no enough mem";
        lVar7 = 0x2f;
        goto LAB_001023b3;
      }
      local_638._M_next = *(_List_node_base **)((long)plVar8 + 0x10);
    } while (*(int *)((long)&(local_638._M_next)->_M_next + 4) < local_69c);
    iVar1 = *(int *)((long)&(local_638._M_next)->_M_next + 4);
    std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::remove
              (&freeMemBlockList_abi_cxx11_,(char *)&local_638);
    if (iVar2 == iVar1) {
      p_Var9 = (_List_node_base *)operator_new(0x18);
      p_Var9[1]._M_next = local_638._M_next;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      usedMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
      _M_node._M_size =
           usedMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
           _M_impl._M_node._M_size + 1;
      p_Var9 = (_List_node_base *)operator_new(0x40);
      pidCount = pidCount + 1;
      *(int *)&p_Var9->_M_next = pidCount;
      strcpy((char *)((long)&p_Var9->_M_next + 4),(char *)&local_678);
      p_Var9[3]._M_prev = local_638._M_next;
      p_Var10 = (_List_node_base *)operator_new(0x18);
      p_Var10[1]._M_next = p_Var9;
    }
    else {
      p_Var9 = (_List_node_base *)operator_new(8);
      p_Var10 = (_List_node_base *)operator_new(8);
      iVar2 = *(int *)&(local_638._M_next)->_M_next;
      *(int *)&p_Var10->_M_next = iVar2;
      *(int *)((long)&p_Var10->_M_next + 4) = local_69c;
      *(int *)&p_Var9->_M_next = iVar2 + local_69c;
      *(int *)((long)&p_Var9->_M_next + 4) =
           *(int *)((long)&(local_638._M_next)->_M_next + 4) - local_69c;
      p_Var11 = (_List_node_base *)operator_new(0x18);
      p_Var11[1]._M_next = p_Var9;
      std::__detail::_List_node_base::_M_hook(p_Var11);
      freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
      _M_node._M_size =
           freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
           _M_impl._M_node._M_size + 1;
      p_Var9 = (_List_node_base *)operator_new(0x18);
      p_Var9[1]._M_next = p_Var10;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      usedMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
      _M_node._M_size =
           usedMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
           _M_impl._M_node._M_size + 1;
      operator_delete(local_638._M_next);
      p_Var9 = (_List_node_base *)operator_new(0x40);
      pidCount = pidCount + 1;
      *(int *)&p_Var9->_M_next = pidCount;
      strcpy((char *)((long)&p_Var9->_M_next + 4),(char *)&local_678);
      p_Var9[3]._M_prev = p_Var10;
      p_Var10 = (_List_node_base *)operator_new(0x18);
      p_Var10[1]._M_next = p_Var9;
    }
    std::__detail::_List_node_base::_M_hook(p_Var10);
    processList_abi_cxx11_.super__List_base<Process_*,_std::allocator<Process_*>_>._M_impl._M_node.
    _M_size = processList_abi_cxx11_.super__List_base<Process_*,_std::allocator<Process_*>_>._M_impl
              ._M_node._M_size + 1;
  }
  return;
}

Assistant:

void newProcess() {
    // 获取参数
    char name[50];
    memset(name, 0, 50);
    int mem = 0;
    char *p;
    p = strtok(NULL, " ");
    if (!p) {
        cout << "have no enough args" << endl;
        return;
    }
    strcpy(name, p);
    p = strtok(NULL, " ");
    if (!p) {
        cout << "have no enough args" << endl;
        return;
    }
    sscanf(p, "%d", &mem);

    // 将所有的空闲内存按照从小到大的顺序排序
    freeMemBlockList.sort([=](MemBlock *a, MemBlock *b) -> bool {
        return a->length < b->length;
    });

    // 寻找一块最合适的内存
    MemBlock *bestFit = nullptr;
    for (MemBlock *i : freeMemBlockList)
        if (mem <= i->length) {
            bestFit = i;
            break;
        }
    if (bestFit) {
        // 如果这一块内存刚好跟目标大小一样大
        if (mem == bestFit->length) {
            // 从空闲区域移出原来的元素
            freeMemBlockList.remove(bestFit);
            // 将之添加到已经使用区域
            usedMemBlockList.push_back(bestFit);
            // 创建一个新的进程描述d
            Process *process = new Process;
            process->pid = getNewPid();
            strcpy(process->name, name);
            process->memBlock = bestFit;
            // 将进程描述添加到进程表中
            processList.push_back(process);
            // 否则
        } else {
            // 从空闲区移出原来的元素
            freeMemBlockList.remove(bestFit);
            // 将之划分成两份
            MemBlock *free = new MemBlock;
            MemBlock *used = new MemBlock;
            used->start = bestFit->start;
            used->length = mem;
            free->start = used->start + used->length;
            free->length = bestFit->start + bestFit->length - free->start;
            // 将两份分别添加到对应区域
            freeMemBlockList.push_back(free);
            usedMemBlockList.push_back(used);
            // 删除原来的内存块
            delete bestFit;
            // 创建一个新的进程描述
            Process *process = new Process;
            process->pid = getNewPid();
            strcpy(process->name, name);
            process->memBlock = used;
            // 将进程描述添加到进程表中
            processList.push_back(process);
        }
    } else {
        cout << "can't create new process, reason: no enough mem" << endl;
    }
}